

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbnf.cpp
# Opt level: O0

Locale * __thiscall
icu_63::RuleBasedNumberFormat::getRuleSetDisplayNameLocale
          (Locale *__return_storage_ptr__,RuleBasedNumberFormat *this,int32_t index,
          UErrorCode *status)

{
  UBool UVar1;
  int iVar2;
  int32_t iVar3;
  undefined4 extraout_var;
  char *local_d8;
  char *bp;
  char local_c8 [4];
  int32_t cap;
  char buffer [64];
  ConstChar16Ptr local_70;
  undefined1 local_68 [8];
  UnicodeString name;
  UErrorCode *status_local;
  int32_t index_local;
  RuleBasedNumberFormat *this_local;
  Locale *retLocale;
  
  name.fUnion._48_8_ = status;
  UVar1 = ::U_FAILURE(*status);
  if (UVar1 == '\0') {
    if (((this->localizations == (LocalizationInfo *)0x0) || (index < 0)) ||
       (iVar2 = (*this->localizations->_vptr_LocalizationInfo[5])(), iVar2 <= index)) {
      *(undefined4 *)name.fUnion._48_8_ = 1;
      Locale::Locale(__return_storage_ptr__);
    }
    else {
      iVar2 = (*this->localizations->_vptr_LocalizationInfo[6])
                        (this->localizations,(ulong)(uint)index);
      ConstChar16Ptr::ConstChar16Ptr(&local_70,(char16_t *)CONCAT44(extraout_var,iVar2));
      icu_63::UnicodeString::UnicodeString((UnicodeString *)local_68,'\x01',&local_70,-1);
      ConstChar16Ptr::~ConstChar16Ptr(&local_70);
      iVar3 = icu_63::UnicodeString::length((UnicodeString *)local_68);
      iVar2 = iVar3 + 1;
      local_d8 = local_c8;
      if ((iVar2 < 0x41) ||
         (local_d8 = (char *)uprv_malloc_63((long)iVar2), local_d8 != (char *)0x0)) {
        iVar3 = icu_63::UnicodeString::length((UnicodeString *)local_68);
        icu_63::UnicodeString::extract((UnicodeString *)local_68,0,iVar3,local_d8,iVar2,kInvariant);
        Locale::Locale(__return_storage_ptr__,local_d8,(char *)0x0,(char *)0x0,(char *)0x0);
        if (local_d8 != local_c8) {
          uprv_free_63(local_d8);
        }
      }
      else {
        *(undefined4 *)name.fUnion._48_8_ = 7;
        Locale::Locale(__return_storage_ptr__,"",(char *)0x0,(char *)0x0,(char *)0x0);
      }
      icu_63::UnicodeString::~UnicodeString((UnicodeString *)local_68);
    }
  }
  else {
    Locale::Locale(__return_storage_ptr__,"",(char *)0x0,(char *)0x0,(char *)0x0);
  }
  return __return_storage_ptr__;
}

Assistant:

Locale 
RuleBasedNumberFormat::getRuleSetDisplayNameLocale(int32_t index, UErrorCode& status) const {
    if (U_FAILURE(status)) {
        return Locale("");
    }
    if (localizations && index >= 0 && index < localizations->getNumberOfDisplayLocales()) {
        UnicodeString name(TRUE, localizations->getLocaleName(index), -1);
        char buffer[64];
        int32_t cap = name.length() + 1;
        char* bp = buffer;
        if (cap > 64) {
            bp = (char *)uprv_malloc(cap);
            if (bp == NULL) {
                status = U_MEMORY_ALLOCATION_ERROR;
                return Locale("");
            }
        }
        name.extract(0, name.length(), bp, cap, UnicodeString::kInvariant);
        Locale retLocale(bp);
        if (bp != buffer) {
            uprv_free(bp);
        }
        return retLocale;
    }
    status = U_ILLEGAL_ARGUMENT_ERROR;
    Locale retLocale;
    return retLocale;
}